

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::RepeatLoopIfSetInst::Exec
          (RepeatLoopIfSetInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  Char CVar2;
  int iVar3;
  undefined4 uVar4;
  PageAllocation *pPVar5;
  code *pcVar6;
  bool bVar7;
  uint uVar8;
  undefined4 *puVar9;
  size_t sVar10;
  List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> *this_00;
  Program *pPVar11;
  long lVar12;
  LoopInfo *pLVar13;
  int i;
  ulong uVar14;
  ArenaAllocator *alloc;
  
  uVar14 = (ulong)(this->super_RepeatLoopMixin).beginLabel;
  pPVar11 = (matcher->program).ptr;
  if ((ulong)(pPVar11->rep).insts.instsLen < uVar14 + 0x43) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar7) goto LAB_00ef8da7;
    *puVar9 = 0;
    pPVar11 = (matcher->program).ptr;
  }
  lVar12 = *(long *)&pPVar11->rep;
  if (*(char *)(lVar12 + uVar14) != 'G') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar7) goto LAB_00ef8da7;
    *puVar9 = 0;
    pPVar11 = (matcher->program).ptr;
    lVar12 = *(long *)&pPVar11->rep;
  }
  iVar3 = *(int *)(lVar12 + 0x29 + uVar14);
  if (((long)iVar3 < 0) || (pPVar11->numLoops <= iVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar7) goto LAB_00ef8da7;
    *puVar9 = 0;
  }
  lVar12 = lVar12 + uVar14;
  pLVar13 = (matcher->loopInfos).ptr + iVar3;
  if (*(char *)(lVar12 + 0x36) == '\x01') {
    sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.bufferSize;
    if (sVar10 - (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.nextTop < 0x28) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x28);
      sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.bufferSize;
    }
    if (sVar10 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar7) goto LAB_00ef8da7;
      *puVar9 = 0;
    }
    pPVar5 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar10 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar10 + 0x28;
    *(size_t *)((long)&pPVar5[1].pageCount + sVar10) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x28;
    uVar4 = *(undefined4 *)(lVar12 + 0x29);
    *(undefined1 *)((long)&pPVar5[2].pageCount + sVar10) = 1;
    *(undefined ***)((long)&pPVar5[1].segment + sVar10) = &PTR_Print_01543488;
    *(undefined4 *)((long)&pPVar5[2].pageCount + sVar10 + 4) = uVar4;
    *(undefined8 *)((long)&pPVar5[2].segment + sVar10) = *(undefined8 *)pLVar13;
    *(undefined8 *)((long)&pPVar5[3].pageCount + sVar10) = 0;
    if (pLVar13->offsetsOfFollowFirst !=
        (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        0x0) {
      alloc = &((((((matcher->pattern).ptr)->library).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->regexAllocator;
      this_00 = (List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                 *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
      *(ArenaAllocator **)(this_00 + 0x18) = alloc;
      *(undefined ***)this_00 = &PTR_IsReadOnly_014d5058;
      *(undefined8 *)(this_00 + 8) = 0;
      *(undefined4 *)(this_00 + 0x10) = 0;
      *(undefined8 *)(this_00 + 0x20) = 0x400000000;
      *(List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> **)
       ((long)&pPVar5[3].pageCount + sVar10) = this_00;
      JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
      Copy<JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
                (this_00,pLVar13->offsetsOfFollowFirst);
    }
    Matcher::PushStats(matcher,contStack,input);
  }
  uVar8 = pLVar13->number + 1;
  pLVar13->number = uVar8;
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  if (*inputOffset < inputLength) {
    CVar2 = input[*inputOffset];
    if ((ushort)CVar2 < 0x100) {
      if ((*(uint *)(lVar12 + 9 + (ulong)((ushort)CVar2 >> 5) * 4) >> ((ushort)CVar2 & 0x1f) & 1) !=
          0) {
LAB_00ef8b9b:
        if ((*(uint *)(lVar12 + 0x31) == 0xffffffff) || (pLVar13->number < *(uint *)(lVar12 + 0x31))
           ) {
          if (*(char *)(lVar12 + 0x36) == '\x01') {
            if (-1 < *(int *)(lVar12 + 0x3f)) {
              Matcher::DoSaveInnerGroups
                        (matcher,*(int *)(lVar12 + 0x3b),*(int *)(lVar12 + 0x3f),true,input,
                         contStack);
            }
          }
          else {
            uVar8 = *(uint *)(lVar12 + 0x3b);
            iVar3 = *(int *)(lVar12 + 0x3f);
            if ((int)uVar8 <= iVar3) {
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              do {
                if (((int)uVar8 < 0) || (((matcher->program).ptr)->numGroups <= uVar8)) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar9 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                                     ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                                     "groupId >= 0 && groupId < program->numGroups");
                  if (!bVar7) goto LAB_00ef8da7;
                  *puVar9 = 0;
                }
                (matcher->groupInfos).ptr[(int)uVar8].length = 0xffffffff;
                uVar8 = uVar8 + 1;
              } while ((int)uVar8 <= iVar3);
            }
          }
          uVar8 = (this->super_RepeatLoopMixin).beginLabel + 0x43;
          pPVar11 = (matcher->program).ptr;
          if (uVar8 < (pPVar11->rep).insts.instsLen) {
LAB_00ef8ce6:
            *instPointer = (pPVar11->rep).insts.insts.ptr + uVar8;
            return false;
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                             ,0x76d,"(label < program->rep.insts.instsLen)",
                             "label < program->rep.insts.instsLen");
          if (bVar7) {
            *puVar9 = 0;
            pPVar11 = (matcher->program).ptr;
            goto LAB_00ef8ce6;
          }
          goto LAB_00ef8da7;
        }
        goto LAB_00ef8d03;
      }
    }
    else if (((RuntimeCharSet<char16_t> *)(lVar12 + 1))->root != (CharSetNode *)0x0) {
      bVar7 = RuntimeCharSet<char16_t>::Get_helper
                        ((RuntimeCharSet<char16_t> *)(lVar12 + 1),(uint)(ushort)CVar2);
      if (bVar7) goto LAB_00ef8b9b;
      uVar8 = pLVar13->number;
    }
  }
  if (*(uint *)(lVar12 + 0x2d) <= uVar8) {
    uVar8 = *(uint *)(lVar12 + 0x37);
    pPVar11 = (matcher->program).ptr;
    if ((pPVar11->rep).insts.instsLen <= uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x76d,"(label < program->rep.insts.instsLen)",
                         "label < program->rep.insts.instsLen");
      if (!bVar7) {
LAB_00ef8da7:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar9 = 0;
      pPVar11 = (matcher->program).ptr;
    }
    *instPointer = (pPVar11->rep).insts.insts.ptr + uVar8;
    return false;
  }
LAB_00ef8d03:
  bVar7 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  return bVar7;
}

Assistant:

inline bool RepeatLoopIfSetInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopIfSetInst* begin = matcher.L2I(BeginLoopIfSet, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        if (begin->hasInnerNondet)
        {
            // May end up backtracking into loop body for iteration just completed: see above.
            PUSH(contStack, RestoreLoopCont, begin->loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        loopInfo->number++;

#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && begin->set.Get(input[inputOffset]))
        {
            if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
            {
                // If the loop body's first set and the loop's follow set are disjoint, we can just fail here since
                // we know the next character in the input is in the loop body's first set.
                return matcher.Fail(FAIL_PARAMETERS);
            }

            // Commit to one more iteration
            if (begin->hasInnerNondet)
            {
                // If it backtracks into the loop body of an earlier iteration, it must restore inner groups for that iteration.
                // Save the inner groups and reset them for the next iteration.
                matcher.SaveInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId, true, input, contStack);
            }
            else
            {
                // If it backtracks, the entire loop will fail, so no need to restore groups. Just reset the inner groups for
                // the next iteration.
                matcher.ResetInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId);
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopIfSetInst));
            return false;
        }

        if (loopInfo->number < begin->repeats.lower)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        // Proceed to exit
        instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        return false;
    }